

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::BufferEvictionNode::TryGetBlockHandle(BufferEvictionNode *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  type handle_p_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BufferEvictionNode *in_RSI;
  shared_ptr<duckdb::BlockHandle,_true> sVar3;
  shared_ptr<duckdb::BlockHandle,_true> handle_p;
  shared_ptr<duckdb::BlockHandle,_true> local_28;
  
  weak_ptr<duckdb::BlockHandle,_true>::lock((weak_ptr<duckdb::BlockHandle,_true> *)&local_28);
  if (local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    handle_p_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*(&local_28);
    bVar2 = CanUnload(in_RSI,handle_p_00);
    _Var1._M_pi = local_28.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    if (bVar2) {
      local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var1._M_pi;
      local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_00492231;
    }
  }
  (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00492231:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> BufferEvictionNode::TryGetBlockHandle() {
	auto handle_p = handle.lock();
	if (!handle_p) {
		// BlockHandle has been destroyed
		return nullptr;
	}
	if (!CanUnload(*handle_p)) {
		// handle was used in between
		return nullptr;
	}
	// this is the latest node in the queue with this handle
	return handle_p;
}